

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  byte bVar6;
  int iVar7;
  ImGuiTableSettings *p;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  p = (ImGuiTableSettings *)(pcVar4 + 4);
  if (pcVar4 == (char *)0x0) {
    p = (ImGuiTableSettings *)0x0;
  }
  for (; p != (ImGuiTableSettings *)0x0;
      p = ImChunkStream<ImGuiTableSettings>::next_chunk(&ctx->SettingsTables,p)) {
    if (p->ID != 0) {
      uVar2 = p->SaveFlags;
      auVar12._4_4_ = uVar2;
      auVar12._0_4_ = uVar2;
      auVar12._8_4_ = uVar2;
      auVar12._12_4_ = uVar2;
      auVar12 = vpand_avx(auVar12,_DAT_001e5f60);
      auVar12 = vpcmpeqd_avx(auVar12,_DAT_001cf0b0);
      if ((auVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar3 = (buf->Buf).Size;
        iVar7 = iVar3 + -1;
        if (iVar3 == 0) {
          iVar7 = 0;
        }
        ImVector<char>::reserve(&buf->Buf,iVar7 + p->ColumnsCount * 0x32 + 0x1e);
        ImGuiTextBuffer::appendf
                  (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)p->ID,
                   (ulong)(uint)(int)p->ColumnsCount);
        fVar1 = p->RefScale;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
        }
        uVar9 = vmovmskps_avx(auVar12);
        pbVar10 = (byte *)((long)&p[1].RefScale + 3);
        for (uVar11 = 0; (int)uVar11 < (int)p->ColumnsCount; uVar11 = uVar11 + 1) {
          ImGuiTextBuffer::appendf(buf,"Column %-2d",(ulong)uVar11);
          uVar8 = 0;
          if (*(int *)(pbVar10 + -7) != 0) {
            ImGuiTextBuffer::appendf(buf," UserID=%08X");
            uVar8 = extraout_var;
          }
          if ((uVar2 & 1) != 0) {
            bVar6 = *pbVar10;
            if ((bVar6 & 8) != 0) {
              ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar10 + -0xb));
              bVar6 = *pbVar10;
              uVar8 = extraout_var_00;
            }
            if ((bVar6 & 8) == 0) {
              ImGuiTextBuffer::appendf
                        (buf," Width=%d",CONCAT44(uVar8,(int)*(float *)(pbVar10 + -0xb)));
            }
          }
          if ((byte)((byte)uVar9 >> 3) == 0) {
            ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar10 >> 2 & 1));
          }
          if ((uVar9 & 4) == 0) {
            ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar10[-2]);
          }
          if (((uVar9 & 2) == 0) && ((int)(char)pbVar10[-1] != 0xffffffff)) {
            uVar5 = 0x5e;
            if ((*pbVar10 & 3) == 1) {
              uVar5 = 0x76;
            }
            ImGuiTextBuffer::appendf(buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar10[-1],uVar5);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
          pbVar10 = pbVar10 + 0xc;
        }
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}